

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__on_seek_ogg(void *pUserData,int offset,ma_dr_flac_seek_origin origin)

{
  uint uVar1;
  ma_bool32 mVar2;
  int iVar3;
  int iVar4;
  
  if (origin == ma_dr_flac_seek_origin_start) {
    mVar2 = ma_dr_flac_oggbs__seek_physical
                      ((ma_dr_flac_oggbs *)pUserData,(long)*(int *)((long)pUserData + 0x20),
                       ma_dr_flac_seek_origin_start);
    if (mVar2 == 0) {
      return 0;
    }
    mVar2 = ma_dr_flac_oggbs__goto_next_page
                      ((ma_dr_flac_oggbs *)pUserData,ma_dr_flac_ogg_fail_on_crc_mismatch);
    if (mVar2 == 0) {
      return 0;
    }
  }
  iVar4 = 0;
  while( true ) {
    iVar3 = offset - iVar4;
    if (iVar3 == 0 || offset < iVar4) {
      return 1;
    }
    uVar1 = *(uint *)((long)pUserData + 0x270);
    if ((ulong)(long)iVar3 <= (ulong)uVar1) break;
    if (uVar1 != 0) {
      iVar4 = iVar4 + uVar1;
      *(undefined4 *)((long)pUserData + 0x270) = 0;
    }
    mVar2 = ma_dr_flac_oggbs__goto_next_page
                      ((ma_dr_flac_oggbs *)pUserData,ma_dr_flac_ogg_fail_on_crc_mismatch);
    if (mVar2 == 0) {
      return 0;
    }
  }
  *(uint *)((long)pUserData + 0x270) = uVar1 - iVar3;
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac__on_seek_ogg(void* pUserData, int offset, ma_dr_flac_seek_origin origin)
{
    ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pUserData;
    int bytesSeeked = 0;
    MA_DR_FLAC_ASSERT(oggbs != NULL);
    MA_DR_FLAC_ASSERT(offset >= 0);
    if (origin == ma_dr_flac_seek_origin_start) {
        if (!ma_dr_flac_oggbs__seek_physical(oggbs, (int)oggbs->firstBytePos, ma_dr_flac_seek_origin_start)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_fail_on_crc_mismatch)) {
            return MA_FALSE;
        }
        return ma_dr_flac__on_seek_ogg(pUserData, offset, ma_dr_flac_seek_origin_current);
    }
    MA_DR_FLAC_ASSERT(origin == ma_dr_flac_seek_origin_current);
    while (bytesSeeked < offset) {
        int bytesRemainingToSeek = offset - bytesSeeked;
        MA_DR_FLAC_ASSERT(bytesRemainingToSeek >= 0);
        if (oggbs->bytesRemainingInPage >= (size_t)bytesRemainingToSeek) {
            bytesSeeked += bytesRemainingToSeek;
            (void)bytesSeeked;
            oggbs->bytesRemainingInPage -= bytesRemainingToSeek;
            break;
        }
        if (oggbs->bytesRemainingInPage > 0) {
            bytesSeeked += (int)oggbs->bytesRemainingInPage;
            oggbs->bytesRemainingInPage = 0;
        }
        MA_DR_FLAC_ASSERT(bytesRemainingToSeek > 0);
        if (!ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_fail_on_crc_mismatch)) {
            return MA_FALSE;
        }
    }
    return MA_TRUE;
}